

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_property_reader.h
# Opt level: O0

void __thiscall
draco::PlyPropertyReader<int>::PlyPropertyReader(PlyPropertyReader<int> *this,PlyProperty *property)

{
  DataType DVar1;
  PlyProperty *in_RSI;
  function<int_(int)> *in_RDI;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffb8;
  function<int_(int)> *in_stack_ffffffffffffffc0;
  
  *(PlyProperty **)&(in_RDI->super__Function_base)._M_functor = in_RSI;
  std::function<int_(int)>::function(in_RDI);
  DVar1 = PlyProperty::data_type(in_RSI);
  switch(DVar1) {
  case DT_INT8:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case DT_UINT8:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case DT_INT16:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case DT_UINT16:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case DT_INT32:
    std::function<int(int)>::operator=(in_RDI,in_stack_ffffffffffffffb8);
    break;
  case DT_UINT32:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  default:
    break;
  case DT_FLOAT32:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,(anon_class_8_1_8991fb9c *)in_RDI);
    break;
  case DT_FLOAT64:
    std::function<int(int)>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

explicit PlyPropertyReader(const PlyProperty *property)
      : property_(property) {
    // Find the suitable function for converting values.
    switch (property->data_type()) {
      case DT_UINT8:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint8_t>(val_id);
        };
        break;
      case DT_INT8:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int8_t>(val_id);
        };
        break;
      case DT_UINT16:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint16_t>(val_id);
        };
        break;
      case DT_INT16:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int16_t>(val_id);
        };
        break;
      case DT_UINT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint32_t>(val_id);
        };
        break;
      case DT_INT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int32_t>(val_id);
        };
        break;
      case DT_FLOAT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<float>(val_id);
        };
        break;
      case DT_FLOAT64:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<double>(val_id);
        };
        break;
      default:
        break;
    }
  }